

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ObjMergeOrder(Of_Man_t *p,int iObj)

{
  int nCutNum_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int fCompl0;
  int fCompl1;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  word wVar11;
  int *piVar12;
  int fIsXor;
  Of_Cut_t *pCut2Lim_1;
  Of_Cut_t *pCut2_1;
  int fComp2;
  int nCuts2_1;
  Of_Cut_t pCuts2_1 [32];
  Of_Cut_t *pCut2Lim;
  Of_Cut_t *pCut2;
  int nCuts2;
  int fCompE;
  Gia_Obj_t *pObjE;
  Of_Cut_t pCuts2 [32];
  int nCutsR;
  int i;
  Of_Cut_t *pCut1Lim;
  Of_Cut_t *pCut0Lim;
  Of_Cut_t *pCut1;
  Of_Cut_t *pCut0;
  int iSibl;
  int fComp1;
  int fComp0;
  int nCuts1;
  int nCuts0;
  int nCutNum;
  int nLutSize;
  int nGiaRefs;
  Gia_Obj_t *pObj;
  Of_Cut_t *pCutsR [32];
  Of_Cut_t pCuts [32];
  Of_Cut_t pCuts1 [32];
  Of_Cut_t pCuts0 [32];
  int iObj_local;
  Of_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pGia,iObj);
  iVar1 = Gia_ObjRefNumId(p->pGia,iObj);
  iVar1 = iVar1 << 1;
  iVar10 = p->pPars->nLutSize;
  nCutNum_00 = p->pPars->nCutNum;
  iVar2 = Gia_ObjFaninId0(pObj_00,iObj);
  iVar2 = Of_ManPrepareCuts((Of_Cut_t *)(pCuts1[0x1f].pLeaves + 5),p,iVar2,1);
  iVar3 = Gia_ObjFaninId1(pObj_00,iObj);
  iVar3 = Of_ManPrepareCuts((Of_Cut_t *)(pCuts[0x1f].pLeaves + 5),p,iVar3,1);
  fCompl0 = Gia_ObjFaninC0(pObj_00);
  fCompl1 = Gia_ObjFaninC1(pObj_00);
  iVar4 = Gia_ObjSibl(p->pGia,iObj);
  pCuts2[0x1f].pLeaves[5] = 0;
  iVar5 = Gia_ObjIsBuf(pObj_00);
  if (iVar5 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x2ba,"void Of_ObjMergeOrder(Of_Man_t *, int)");
  }
  for (pCuts2[0x1f].pLeaves[6] = 0; pCuts2[0x1f].pLeaves[6] < nCutNum_00;
      pCuts2[0x1f].pLeaves[6] = pCuts2[0x1f].pLeaves[6] + 1) {
    pCutsR[(long)pCuts2[0x1f].pLeaves[6] + -1] =
         (Of_Cut_t *)(pCuts[(long)pCuts2[0x1f].pLeaves[6] + -1].pLeaves + 5);
  }
  if (iVar4 != 0) {
    pObj_01 = Gia_ObjSiblObj(p->pGia,iObj);
    uVar6 = Gia_ObjPhase(pObj_00);
    uVar7 = Gia_ObjPhase(pObj_01);
    iVar4 = Of_ManPrepareCuts((Of_Cut_t *)&pObjE,p,iVar4,0);
    pCuts2_1[0x1f].pLeaves._20_8_ = pCuts2[(long)iVar4 + -1].pLeaves + 5;
    for (pCut2Lim = (Of_Cut_t *)&pObjE; pCut2Lim < (ulong)pCuts2_1[0x1f].pLeaves._20_8_;
        pCut2Lim = pCut2Lim + 1) {
      memcpy(pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1],pCut2Lim,0x30);
      if (p->pPars->fCutMin != 0) {
        uVar8 = Abc_LitNotCond(*(uint *)&pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->field_0x10 &
                               0x7ffffff,uVar6 ^ uVar7);
        *(uint *)&pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->field_0x10 =
             *(uint *)&pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->field_0x10 & 0xf8000000 |
             uVar8 & 0x7ffffff;
      }
      Of_CutParams(p,pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1],iVar1);
      pCuts2[0x1f].pLeaves[5] = Of_SetAddCut((Of_Cut_t **)&pObj,pCuts2[0x1f].pLeaves[5],nCutNum_00);
    }
  }
  iVar4 = Gia_ObjIsMuxId(p->pGia,iObj);
  if (iVar4 == 0) {
    iVar4 = Gia_ObjIsXor(pObj_00);
    p->CutCount[0] = (double)(iVar2 * iVar3) + p->CutCount[0];
    for (pCut1 = (Of_Cut_t *)(pCuts1[0x1f].pLeaves + 5);
        pCut1 < (Of_Cut_t *)(pCuts1[(long)iVar2 + 0x1f].pLeaves + 5); pCut1 = pCut1 + 1) {
      for (pCut0Lim = (Of_Cut_t *)(pCuts[0x1f].pLeaves + 5);
          pCut0Lim < (Of_Cut_t *)(pCuts[(long)iVar3 + 0x1f].pLeaves + 5); pCut0Lim = pCut0Lim + 1) {
        if (((int)((*(uint *)&pCut1->field_0x10 >> 0x1b) + (*(uint *)&pCut0Lim->field_0x10 >> 0x1b))
             <= iVar10) || (iVar5 = Of_CutCountBits(pCut1->Sign | pCut0Lim->Sign), iVar5 <= iVar10))
        {
          p->CutCount[1] = p->CutCount[1] + 1.0;
          iVar5 = Of_CutMergeOrder(pCut1,pCut0Lim,pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1],iVar10)
          ;
          if ((iVar5 != 0) &&
             (iVar5 = Of_SetLastCutIsContained((Of_Cut_t **)&pObj,pCuts2[0x1f].pLeaves[5]),
             iVar5 == 0)) {
            p->CutCount[2] = p->CutCount[2] + 1.0;
            if ((p->pPars->fCutMin != 0) &&
               (iVar5 = Of_CutComputeTruth6(p,pCut1,pCut0Lim,fCompl0,fCompl1,
                                            pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1],iVar4),
               iVar5 != 0)) {
              wVar11 = Of_CutGetSign(pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->pLeaves,
                                     *(uint *)&pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->
                                               field_0x10 >> 0x1b);
              pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->Sign = wVar11;
            }
            Of_CutParams(p,pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1],iVar1);
            pCuts2[0x1f].pLeaves[5] =
                 Of_SetAddCut((Of_Cut_t **)&pObj,pCuts2[0x1f].pLeaves[5],nCutNum_00);
          }
        }
      }
    }
  }
  else {
    iVar4 = Gia_ObjFaninId2(p->pGia,iObj);
    iVar4 = Of_ManPrepareCuts((Of_Cut_t *)&fComp2,p,iVar4,1);
    iVar5 = Gia_ObjFaninC2(p->pGia,pObj_00);
    p->CutCount[0] = (double)(iVar2 * iVar3 * iVar4) + p->CutCount[0];
    for (pCut1 = (Of_Cut_t *)(pCuts1[0x1f].pLeaves + 5);
        pCut1 < (Of_Cut_t *)(pCuts1[(long)iVar2 + 0x1f].pLeaves + 5); pCut1 = pCut1 + 1) {
      for (pCut0Lim = (Of_Cut_t *)(pCuts[0x1f].pLeaves + 5);
          pCut0Lim < (Of_Cut_t *)(pCuts[(long)iVar3 + 0x1f].pLeaves + 5); pCut0Lim = pCut0Lim + 1) {
        for (pCut2Lim_1 = (Of_Cut_t *)&fComp2;
            pCut2Lim_1 < (Of_Cut_t *)(&fComp2 + (long)iVar4 * 0xc); pCut2Lim_1 = pCut2Lim_1 + 1) {
          iVar9 = Of_CutCountBits(pCut1->Sign | pCut0Lim->Sign | pCut2Lim_1->Sign);
          if (iVar9 <= iVar10) {
            p->CutCount[1] = p->CutCount[1] + 1.0;
            iVar9 = Of_CutMergeOrderMux(pCut1,pCut0Lim,pCut2Lim_1,
                                        pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1],iVar10);
            if ((iVar9 != 0) &&
               (iVar9 = Of_SetLastCutIsContained((Of_Cut_t **)&pObj,pCuts2[0x1f].pLeaves[5]),
               iVar9 == 0)) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              if ((p->pPars->fCutMin != 0) &&
                 (iVar9 = Of_CutComputeTruthMux6
                                    (p,pCut1,pCut0Lim,pCut2Lim_1,fCompl0,fCompl1,iVar5,
                                     pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]), iVar9 != 0)) {
                wVar11 = Of_CutGetSign(pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->pLeaves,
                                       *(uint *)&pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->
                                                 field_0x10 >> 0x1b);
                pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1]->Sign = wVar11;
              }
              Of_CutParams(p,pCutsR[(long)pCuts2[0x1f].pLeaves[5] + -1],iVar1);
              pCuts2[0x1f].pLeaves[5] =
                   Of_SetAddCut((Of_Cut_t **)&pObj,pCuts2[0x1f].pLeaves[5],nCutNum_00);
            }
          }
        }
      }
    }
  }
  if ((0 < pCuts2[0x1f].pLeaves[5]) && (pCuts2[0x1f].pLeaves[5] < nCutNum_00)) {
    Of_ObjSetCutFlow(p,iObj,*(int *)(pObj + 1));
    Of_ObjSetCutDelay(p,iObj,pObj->Value);
    iVar10 = Of_ManSaveCuts(p,(Of_Cut_t **)&pObj,pCuts2[0x1f].pLeaves[5]);
    piVar12 = Vec_IntEntryP(&p->vCutSets,iObj);
    *piVar12 = iVar10;
    p->CutCount[3] = (double)pCuts2[0x1f].pLeaves[5] + p->CutCount[3];
    return;
  }
  __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                ,0x304,"void Of_ObjMergeOrder(Of_Man_t *, int)");
}

Assistant:

void Of_ObjMergeOrder( Of_Man_t * p, int iObj )
{
    Of_Cut_t pCuts0[OF_CUT_MAX], pCuts1[OF_CUT_MAX], pCuts[OF_CUT_MAX], * pCutsR[OF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int nGiaRefs = 2*Gia_ObjRefNumId(p->pGia, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Of_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Of_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Of_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Of_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( p->pPars->fCutMin )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        int nCuts2  = Of_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Of_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Of_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d\n", iObj );
        for ( i = 0; i < nCutsR; i++ )
            Of_Cutprintf( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    //assert( Of_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Of_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Of_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Of_ManSaveCuts(p, pCutsR, nCutsR);
    p->CutCount[3] += nCutsR;
}